

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void * hash_table_new_item(hash_table_t *table,void *key)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  hash_table_bucket_t *phVar4;
  double dVar5;
  uint local_44;
  uint i;
  uint collisions;
  hash_table_bucket_t *new_bucket;
  hash_table_bucket_t **b;
  double load;
  int try;
  void *key_local;
  hash_table_t *table_local;
  
  dVar5 = ((double)table->n_items + 1.0) / (double)table->n_buckets;
  if (table->max_load <= dVar5 && dVar5 != table->max_load) {
    hash_table_increase_buckets(table);
  }
  load._4_4_ = 0;
  while( true ) {
    if (4 < load._4_4_) {
      fprintf(_stderr,"hash_table_new_item: Beaten by the odds; too many rehashes\n");
      abort();
    }
    local_44 = 0;
    sVar1 = (table->ghash).mult;
    sVar3 = (*table->hash)(key);
    phVar4 = table->buckets +
             (sVar1 * sVar3 + (table->ghash).add >>
              (0x40U - (char)(table->ghash).log2_buckets & 0x3f) & 0xffffffff);
    while (new_bucket = (hash_table_bucket_t *)&phVar4->next, new_bucket->data != (void *)0x0) {
      iVar2 = (*table->is_equal)(key,*new_bucket->data);
      if (iVar2 != 0) {
        return *new_bucket->data;
      }
      local_44 = local_44 + 1;
      phVar4 = (hash_table_bucket_t *)new_bucket->data;
    }
    if (local_44 <= table->max_collisions) break;
    hash_table_increase_buckets(table);
    load._4_4_ = load._4_4_ + 1;
  }
  if (table->free_buckets == (hash_table_bucket_t *)0x0) {
    hash_table_increase_free_buckets(table);
  }
  phVar4 = table->free_buckets;
  table->free_buckets = table->free_buckets->next;
  phVar4->next = (hash_table_bucket_t *)0x0;
  phVar4->data = (void *)0x0;
  new_bucket->data = phVar4;
  *(void **)new_bucket->data = key;
  table->n_items = table->n_items + 1;
  return *new_bucket->data;
}

Assistant:

void * hash_table_new_item( hash_table_t * table, void * key )
{
    int try;
    double load = (table->n_items + 1.0)/table->n_buckets;
    hash_table_bucket_t ** b;
    hash_table_bucket_t * new_bucket;

    if (load > table->max_load)
        hash_table_increase_buckets( table );

    for ( try = 0; try < 5; ++try ) {
        unsigned collisions = 0;
        unsigned i = (unsigned) hash( table->ghash, (* table->hash )( key ) );
        b = & table->buckets[i].next;
        
        while (*b) {
            if ( (*table->is_equal)(key, (*b)->data) )
                return (*b)->data;
            collisions += 1;
            b = &(*b)->next;
        }

        if ( collisions > table->max_collisions ) 
            hash_table_increase_buckets( table );
        else
            goto found_item;
    }

    fprintf(stderr, "hash_table_new_item: Beaten by the odds; "
            "too many rehashes\n");
    abort();

found_item:

    if ( table->free_buckets == NULL )
        hash_table_increase_free_buckets( table );

    /* pop a free bucket from the free list */
    new_bucket = table->free_buckets;
    table->free_buckets = table->free_buckets->next;
    new_bucket->next = NULL;
    new_bucket->data = NULL;

    /* append it to the end of the bucket list */
    *b = new_bucket;
    (*b)->data = key;
    table->n_items += 1;
    return (*b)->data;
}